

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O2

unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
* GatherSamplers(unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                 *__return_storage_ptr__,Animation *anim)

{
  undefined8 in_RAX;
  mapped_type *pmVar1;
  uint uVar2;
  ulong uVar3;
  pointer pCVar4;
  undefined4 uStack_38;
  uint node_index;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  uVar2 = 0;
  _uStack_38 = in_RAX;
  while( true ) {
    uVar3 = (ulong)uVar2;
    pCVar4 = (anim->channels).
             super__Vector_base<glTF2::Animation::Channel,_std::allocator<glTF2::Animation::Channel>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(anim->channels).
                      super__Vector_base<glTF2::Animation::Channel,_std::allocator<glTF2::Animation::Channel>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 5) <= uVar3)
    break;
    if (pCVar4[uVar3].sampler <
        (int)(((long)(anim->samplers).
                     super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(anim->samplers).
                    super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
      pCVar4 = pCVar4 + uVar3;
      _uStack_38 = CONCAT44((pCVar4->target).node.index,uStack_38);
      pmVar1 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_AnimationSamplers>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_AnimationSamplers>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)__return_storage_ptr__,&node_index);
      switch((pCVar4->target).path) {
      case AnimationPath_TRANSLATION:
        pmVar1->translation =
             (anim->samplers).
             super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
             ._M_impl.super__Vector_impl_data._M_start + pCVar4->sampler;
        break;
      case AnimationPath_ROTATION:
        pmVar1->rotation =
             (anim->samplers).
             super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
             ._M_impl.super__Vector_impl_data._M_start + pCVar4->sampler;
        break;
      case AnimationPath_SCALE:
        pmVar1->scale =
             (anim->samplers).
             super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
             ._M_impl.super__Vector_impl_data._M_start + pCVar4->sampler;
        break;
      case AnimationPath_WEIGHTS:
        pmVar1->weight =
             (anim->samplers).
             super__Vector_base<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
             ._M_impl.super__Vector_impl_data._M_start + pCVar4->sampler;
      }
    }
    uVar2 = uVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<unsigned int, AnimationSamplers> GatherSamplers(Animation &anim) {
	std::unordered_map<unsigned int, AnimationSamplers> samplers;
	for (unsigned int c = 0; c < anim.channels.size(); ++c) {
		Animation::Channel &channel = anim.channels[c];
		if (channel.sampler >= static_cast<int>(anim.samplers.size())) {
			continue;
		}

		const unsigned int node_index = channel.target.node.GetIndex();

		AnimationSamplers &sampler = samplers[node_index];
		if (channel.target.path == AnimationPath_TRANSLATION) {
			sampler.translation = &anim.samplers[channel.sampler];
		} else if (channel.target.path == AnimationPath_ROTATION) {
			sampler.rotation = &anim.samplers[channel.sampler];
		} else if (channel.target.path == AnimationPath_SCALE) {
			sampler.scale = &anim.samplers[channel.sampler];
		} else if (channel.target.path == AnimationPath_WEIGHTS) {
			sampler.weight = &anim.samplers[channel.sampler];
		}
	}

	return samplers;
}